

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rexchange.cpp
# Opt level: O2

void enq(Block *b,ProxyWithLink *cp)

{
  Link *pLVar1;
  pointer pBVar2;
  mapped_type *pmVar3;
  int i;
  long lVar4;
  long lVar5;
  
  pLVar1 = cp->link_;
  lVar5 = 0;
  for (lVar4 = 0;
      pBVar2 = (pLVar1->neighbors_).super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>.
               _M_impl.super__Vector_impl_data._M_start,
      lVar4 < (int)((ulong)((long)(pLVar1->neighbors_).
                                  super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>.
                                  _M_impl.super__Vector_impl_data._M_finish - (long)pBVar2) >> 3);
      lVar4 = lVar4 + 1) {
    pmVar3 = std::
             map<diy::BlockID,_diy::MemoryBuffer,_std::less<diy::BlockID>,_std::allocator<std::pair<const_diy::BlockID,_diy::MemoryBuffer>_>_>
             ::operator[](&(cp->super_Proxy).outgoing_,(key_type *)((long)&pBVar2->gid + lVar5));
    (*(pmVar3->super_BinaryBuffer)._vptr_BinaryBuffer[2])(pmVar3,b,4);
    lVar5 = lVar5 + 8;
  }
  b->count = b->count + 1;
  return;
}

Assistant:

void enq(Block* b, const diy::Master::ProxyWithLink& cp)
{
    diy::Link* l = cp.link();

    for (int i = 0; i < l->size(); ++i)
        cp.enqueue(l->target(i), b->count);
    b->count++;
}